

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O3

VP8Encoder * InitVP8Encoder(WebPConfig *config,WebPPicture *picture)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  VP8Encoder *enc;
  VP8MBInfo *pVVar6;
  VP8RDLevel VVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  LFStats *paadVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  uint8_t *puVar17;
  DError *paaiVar18;
  ulong uVar19;
  WebPConfig *config_1;
  
  iVar8 = config->filter_strength;
  iVar5 = config->autofilter;
  lVar13 = 0x81f;
  if (iVar5 == 0) {
    lVar13 = 0;
  }
  uVar19 = (long)picture->width + 0xf;
  iVar16 = (int)uVar19 >> 4;
  iVar14 = picture->height + 0xf >> 4;
  iVar1 = iVar16 * 4 + 1;
  lVar11 = (long)((iVar14 * 4 + 1) * iVar1);
  uVar19 = uVar19 & 0xfffffffffffffff0;
  lVar9 = (long)iVar16;
  iVar3 = iVar14 * iVar16;
  lVar15 = (long)iVar3;
  lVar2 = uVar19 * 2;
  if ((config->quality <= 98.0) || (1 < config->pass)) {
    lVar10 = lVar9 << 2;
  }
  else {
    lVar10 = 0;
  }
  enc = (VP8Encoder *)
        WebPSafeMalloc(lVar10 + lVar2 + lVar13 + lVar9 * 4 + lVar15 * 4 + lVar11 + 0x5cf9,1);
  if (enc == (VP8Encoder *)0x0) {
    if (picture->error_code == VP8_ENC_OK) {
      picture->error_code = VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
  }
  else {
    pVVar6 = (VP8MBInfo *)
             ((ulong)((long)&enc[1].filter_hdr.i4x4_lf_delta + 3U) & 0xffffffffffffffe0);
    memset(enc,0,0x5c98);
    enc->num_parts = 1 << ((byte)config->partitions & 0x1f);
    enc->mb_w = iVar16;
    enc->mb_h = iVar14;
    enc->preds_w = iVar1;
    enc->mb_info = pVVar6;
    enc->preds = &pVVar6[lVar15].alpha + iVar1;
    paadVar12 = (LFStats *)0x0;
    if (iVar5 != 0) {
      paadVar12 = (LFStats *)
                  ((ulong)(&pVVar6[lVar15 + lVar9 + 0x10].field_0x2 + lVar11) & 0xffffffffffffffe0);
    }
    enc->nz = (uint32_t *)((ulong)(&pVVar6[lVar15 + 7].field_0x3 + lVar11) & 0xffffffffffffffe0 | 4)
    ;
    enc->lf_stats = paadVar12;
    puVar17 = (uint8_t *)
              ((ulong)(&pVVar6[lVar15 + lVar9 + 0x10].field_0x2 + lVar11 + lVar13) &
              0xffffffffffffffe0);
    enc->y_top = puVar17;
    enc->uv_top = puVar17 + (int)uVar19;
    paaiVar18 = (DError *)(puVar17 + lVar2);
    if (lVar10 == 0) {
      paaiVar18 = (DError *)0x0;
    }
    enc->top_derr = paaiVar18;
    enc->config = config;
    uVar4 = 2;
    if (0 < iVar8 || 0 < iVar5) {
      uVar4 = (uint)(config->filter_type != 1);
    }
    enc->profile = uVar4;
    enc->pic = picture;
    iVar5 = 100 - config->partition_limit;
    iVar8 = config->method;
    enc->method = iVar8;
    VVar7 = RD_OPT_TRELLIS_ALL;
    if ((iVar8 < 6) && (VVar7 = RD_OPT_TRELLIS, iVar8 != 5)) {
      VVar7 = (VP8RDLevel)(2 < iVar8);
    }
    enc->rd_opt_level = VVar7;
    enc->max_i4_header_bits = (uint)(iVar5 * iVar5 * 0x10000) / 10000;
    enc->mb_header_limit = (int)(0x3fc00000 / (long)iVar3);
    enc->thread_level = config->thread_level;
    uVar4 = 1;
    if (config->target_size < 1) {
      uVar4 = (uint)(0.0 < config->target_PSNR);
    }
    enc->do_search = uVar4;
    if ((config->low_memory == 0) &&
       (enc->use_tokens = (uint)(VVar7 != RD_OPT_NONE), VVar7 != RD_OPT_NONE)) {
      enc->num_parts = 1;
    }
    VP8EncDspInit();
    VP8DefaultProbas(enc);
    iVar8 = enc->config->segments;
    (enc->segment_hdr).num_segments = iVar8;
    (enc->segment_hdr).update_map = (uint)(1 < iVar8);
    (enc->segment_hdr).size = 0;
    (enc->filter_hdr).simple = 1;
    (enc->filter_hdr).level = 0;
    (enc->filter_hdr).sharpness = 0;
    (enc->filter_hdr).i4x4_lf_delta = 0;
    puVar17 = enc->preds;
    if (-1 < enc->mb_w) {
      iVar8 = enc->preds_w;
      lVar13 = -1;
      do {
        puVar17[lVar13 - iVar8] = '\0';
        lVar13 = lVar13 + 1;
      } while (lVar13 < (long)enc->mb_w * 4);
    }
    if (0 < enc->mb_h) {
      iVar8 = 0;
      do {
        puVar17[(long)enc->preds_w * (long)iVar8 + -1] = '\0';
        iVar8 = iVar8 + 1;
      } while (iVar8 < enc->mb_h * 4);
    }
    enc->nz[-1] = 0;
    VP8EncDspCostInit();
    VP8EncInitAlpha(enc);
    VP8TBufferInit(&enc->tokens,(int)((float)(iVar3 * 4) * ((config->quality * 5.0) / 100.0 + 1.0)))
    ;
  }
  return enc;
}

Assistant:

static VP8Encoder* InitVP8Encoder(const WebPConfig* const config,
                                  WebPPicture* const picture) {
  VP8Encoder* enc;
  const int use_filter =
      (config->filter_strength > 0) || (config->autofilter > 0);
  const int mb_w = (picture->width + 15) >> 4;
  const int mb_h = (picture->height + 15) >> 4;
  const int preds_w = 4 * mb_w + 1;
  const int preds_h = 4 * mb_h + 1;
  const size_t preds_size = preds_w * preds_h * sizeof(*enc->preds);
  const int top_stride = mb_w * 16;
  const size_t nz_size = (mb_w + 1) * sizeof(*enc->nz) + WEBP_ALIGN_CST;
  const size_t info_size = mb_w * mb_h * sizeof(*enc->mb_info);
  const size_t samples_size =
      2 * top_stride * sizeof(*enc->y_top)   // top-luma/u/v
      + WEBP_ALIGN_CST;                      // align all
  const size_t lf_stats_size =
      config->autofilter ? sizeof(*enc->lf_stats) + WEBP_ALIGN_CST : 0;
  const size_t top_derr_size =
      (config->quality <= ERROR_DIFFUSION_QUALITY || config->pass > 1) ?
          mb_w * sizeof(*enc->top_derr) : 0;
  uint8_t* mem;
  const uint64_t size = (uint64_t)sizeof(*enc)   // main struct
                      + WEBP_ALIGN_CST           // cache alignment
                      + info_size                // modes info
                      + preds_size               // prediction modes
                      + samples_size             // top/left samples
                      + top_derr_size            // top diffusion error
                      + nz_size                  // coeff context bits
                      + lf_stats_size;           // autofilter stats

#ifdef PRINT_MEMORY_INFO
  printf("===================================\n");
  printf("Memory used:\n"
         "             encoder: %ld\n"
         "                info: %ld\n"
         "               preds: %ld\n"
         "         top samples: %ld\n"
         "       top diffusion: %ld\n"
         "            non-zero: %ld\n"
         "            lf-stats: %ld\n"
         "               total: %ld\n",
         sizeof(*enc) + WEBP_ALIGN_CST, info_size,
         preds_size, samples_size, top_derr_size, nz_size, lf_stats_size, size);
  printf("Transient object sizes:\n"
         "      VP8EncIterator: %ld\n"
         "        VP8ModeScore: %ld\n"
         "      VP8SegmentInfo: %ld\n"
         "         VP8EncProba: %ld\n"
         "             LFStats: %ld\n",
         sizeof(VP8EncIterator), sizeof(VP8ModeScore),
         sizeof(VP8SegmentInfo), sizeof(VP8EncProba),
         sizeof(LFStats));
  printf("Picture size (yuv): %ld\n",
         mb_w * mb_h * 384 * sizeof(uint8_t));
  printf("===================================\n");
#endif
  mem = (uint8_t*)WebPSafeMalloc(size, sizeof(*mem));
  if (mem == NULL) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    return NULL;
  }
  enc = (VP8Encoder*)mem;
  mem = (uint8_t*)WEBP_ALIGN(mem + sizeof(*enc));
  memset(enc, 0, sizeof(*enc));
  enc->num_parts = 1 << config->partitions;
  enc->mb_w = mb_w;
  enc->mb_h = mb_h;
  enc->preds_w = preds_w;
  enc->mb_info = (VP8MBInfo*)mem;
  mem += info_size;
  enc->preds = mem + 1 + enc->preds_w;
  mem += preds_size;
  enc->nz = 1 + (uint32_t*)WEBP_ALIGN(mem);
  mem += nz_size;
  enc->lf_stats = lf_stats_size ? (LFStats*)WEBP_ALIGN(mem) : NULL;
  mem += lf_stats_size;

  // top samples (all 16-aligned)
  mem = (uint8_t*)WEBP_ALIGN(mem);
  enc->y_top = mem;
  enc->uv_top = enc->y_top + top_stride;
  mem += 2 * top_stride;
  enc->top_derr = top_derr_size ? (DError*)mem : NULL;
  mem += top_derr_size;
  assert(mem <= (uint8_t*)enc + size);

  enc->config = config;
  enc->profile = use_filter ? ((config->filter_type == 1) ? 0 : 1) : 2;
  enc->pic = picture;
  enc->percent = 0;

  MapConfigToTools(enc);
  VP8EncDspInit();
  VP8DefaultProbas(enc);
  ResetSegmentHeader(enc);
  ResetFilterHeader(enc);
  ResetBoundaryPredictions(enc);
  VP8EncDspCostInit();
  VP8EncInitAlpha(enc);

  // lower quality means smaller output -> we modulate a little the page
  // size based on quality. This is just a crude 1rst-order prediction.
  {
    const float scale = 1.f + config->quality * 5.f / 100.f;  // in [1,6]
    VP8TBufferInit(&enc->tokens, (int)(mb_w * mb_h * 4 * scale));
  }
  return enc;
}